

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flow.cc
# Opt level: O2

void __thiscall FlowInfo::truncateIndirectJump(FlowInfo *this,PcodeOp *op,int4 failuremode)

{
  Funcdata *this_00;
  FuncCallSpecs *pFVar1;
  PcodeOp *op_00;
  allocator local_41;
  string local_40;
  
  Funcdata::opSetOpcode(this->data,op,CPUI_CALLIND);
  setupCallindSpecs(this,op,failuremode == 2,(FuncCallSpecs *)0x0);
  pFVar1 = Funcdata::getCallSpecs(this->data,op);
  pFVar1->isbadjumptable = true;
  op_00 = artificialHalt(this,&(op->start).pc,0);
  PcodeOpBank::insertAfterDead(&this->data->obank,op_00,op);
  this_00 = this->data;
  std::__cxx11::string::string((string *)&local_40,"Treating indirect jump as call",&local_41);
  Funcdata::warning(this_00,&local_40,&(op->start).pc);
  std::__cxx11::string::~string((string *)&local_40);
  return;
}

Assistant:

void FlowInfo::truncateIndirectJump(PcodeOp *op,int4 failuremode)

{
  data.opSetOpcode(op,CPUI_CALLIND); // Turn jump into call
  bool tryoverride = (failuremode == 2);
  setupCallindSpecs(op,tryoverride,(FuncCallSpecs *)0);
  data.getCallSpecs(op)->setBadJumpTable(true);

  // Create an artificial return
  PcodeOp *truncop = artificialHalt(op->getAddr(),0);
  data.opDeadInsertAfter(truncop,op);

  data.warning("Treating indirect jump as call",op->getAddr());
}